

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<1280,unsigned_long>
               (hashfunc<unsigned_long> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  pfHash p_Var4;
  size_type sVar5;
  byte in_CL;
  byte in_DL;
  char *pcVar6;
  uint in_ESI;
  undefined8 in_RDI;
  byte in_R8B;
  byte in_R9B;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *unaff_retaddr;
  bool result;
  unsigned_long h;
  keytype k;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  undefined4 in_stack_ffffffffffffff1c;
  byte bVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff20;
  Blob<1280> *in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff37;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  pfHash in_stack_ffffffffffffff40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [3];
  
  local_d = in_DL & 1;
  local_e = in_CL & 1;
  local_f = in_R8B & 1;
  local_10 = in_R9B & 1;
  pcVar6 = "exactly";
  if ((in_DL & 1) != 0) {
    pcVar6 = "up to";
  }
  _local_8 = in_RDI;
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x500,pcVar6,(ulong)in_ESI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1482cf);
  Blob<1280>::Blob((Blob<1280> *)&stack0xffffffffffffff38);
  memset(&stack0xffffffffffffff38,0,0xa0);
  if ((local_d & 1) != 0) {
    p_Var4 = hashfunc::operator_cast_to_function_pointer(local_8);
    (*p_Var4)(&stack0xffffffffffffff38,0xa0,0,&stack0xffffffffffffff20);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (in_stack_ffffffffffffff20,
               (value_type_conflict2 *)CONCAT44(in_stack_ffffffffffffff1c,in_ESI));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<1280>,unsigned_long>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
             (bool)in_stack_ffffffffffffff37,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_28);
  printf("%d keys\n",sVar5 & 0xffffffff);
  uVar2 = _local_8;
  bVar7 = 1;
  uVar1 = (ulong)_local_8 >> 0x38;
  bVar3 = TestHashList<unsigned_long>
                    (unaff_retaddr,SUB81(uVar1,0),SUB81((ulong)uVar2 >> 0x30,0),
                     SUB81((ulong)uVar2 >> 0x28,0),SUB81((ulong)uVar2 >> 0x20,0),
                     SUB81((ulong)uVar2 >> 0x18,0));
  bVar7 = bVar3 & bVar7;
  printf("\n");
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffff20);
  return (bool)(bVar7 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}